

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void helper_ctc1_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1,uint32_t fs,uint32_t rt)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uintptr_t unaff_retaddr;
  
  switch(fs) {
  case 1:
    if (rt != 0) {
      return;
    }
    if (((env->active_fpu).fcr0 & 0x10000000) == 0) {
      return;
    }
    if ((env->CP0_Config5 & 4) == 0) goto LAB_008a0465;
    pbVar1 = (byte *)((long)&env->CP0_Status + 3);
    *pbVar1 = *pbVar1 & 0xfb;
    break;
  case 2:
  case 3:
switchD_008a0340_caseD_1b:
    if ((env->insn_flags & 0x2000) == 0) {
      return;
    }
LAB_008a0465:
    do_raise_exception(env,0x14,unaff_retaddr);
  case 4:
    if (rt != 0) {
      return;
    }
    if (((env->active_fpu).fcr0 & 0x10000000) == 0) {
      return;
    }
    if ((env->CP0_Config5 & 4) == 0) goto LAB_008a0465;
    pbVar1 = (byte *)((long)&env->CP0_Status + 3);
    *pbVar1 = *pbVar1 | 4;
    break;
  case 5:
    if (rt != 0) {
      return;
    }
    if (((env->active_fpu).fcr0 & 0x20000000) == 0) {
      return;
    }
    if (((uint)env->CP0_Config5 >> 9 & 1) == 0) {
LAB_008a0534:
      helper_raise_exception_mips64(env,0x14);
    }
    uVar2 = env->CP0_Config5 & 0xfffffeff;
    goto LAB_008a041d;
  case 6:
    if (rt != 0) {
      return;
    }
    if (((env->active_fpu).fcr0 & 0x20000000) == 0) {
      return;
    }
    if (((uint)env->CP0_Config5 >> 9 & 1) == 0) goto LAB_008a0534;
    uVar2 = env->CP0_Config5 | 0x100;
LAB_008a041d:
    env->CP0_Config5 = uVar2;
    break;
  default:
    uVar2 = (uint)arg1;
    switch(fs) {
    case 0x19:
      if ((arg1 & 0xffffff00) != 0 || (env->insn_flags & 0x2000) != 0) {
        return;
      }
      uVar3 = (env->active_fpu).fcr31 & 0x17fffff;
      uVar4 = (uVar2 & 0xfffffffe) << 0x18;
      uVar5 = (uVar2 & 1) << 0x17;
      break;
    case 0x1a:
      if ((arg1 & 0x7c0000) != 0) {
        return;
      }
      uVar3 = (env->active_fpu).fcr31 & 0xfffc0f83;
      uVar5 = uVar2 & 0x3f07c;
      goto LAB_008a04cb;
    default:
      goto switchD_008a0340_caseD_1b;
    case 0x1c:
      if ((arg1 & 0x7c0000) != 0) {
        return;
      }
      uVar3 = (env->active_fpu).fcr31 & 0xfefff07c;
      uVar4 = uVar2 & 0xf83;
      uVar5 = (uVar2 & 4) << 0x16;
      break;
    case 0x1f:
      uVar5 = (env->active_fpu).fcr31;
      uVar5 = (uVar2 ^ uVar5) & (env->active_fpu).fcr31_rw_bitmask ^ uVar5;
      goto LAB_008a04cd;
    }
    uVar5 = uVar5 | uVar4;
LAB_008a04cb:
    uVar5 = uVar5 | uVar3;
LAB_008a04cd:
    (env->active_fpu).fcr31 = uVar5;
    goto LAB_008a04d3;
  }
  compute_hflags(env);
LAB_008a04d3:
  uVar2 = (env->active_fpu).fcr31;
  (env->active_fpu).fp_status.float_rounding_mode = (char)ieee_rm_mips64[uVar2 & 3];
  (env->active_fpu).fp_status.flush_to_zero = (byte)(uVar2 >> 0x18) & 1;
  (env->active_fpu).fp_status.snan_bit_is_one = (uVar2 >> 0x12 & 1) == 0;
  (env->active_fpu).fp_status.float_exception_flags = '\0';
  if (((uVar2 >> 7 & 0x1f | 0x20) & uVar2 >> 0xc) == 0) {
    return;
  }
  do_raise_exception(env,0x17,unaff_retaddr);
}

Assistant:

void helper_ctc1(CPUMIPSState *env, target_ulong arg1, uint32_t fs, uint32_t rt)
{
    switch (fs) {
    case 1:
        /* UFR Alias - Reset Status FR */
        if (!((env->active_fpu.fcr0 & (1 << FCR0_UFRP)) && (rt == 0))) {
            return;
        }
        if (env->CP0_Config5 & (1 << CP0C5_UFR)) {
            env->CP0_Status &= ~(1 << CP0St_FR);
            compute_hflags(env);
        } else {
            do_raise_exception(env, EXCP_RI, GETPC());
        }
        break;
    case 4:
        /* UNFR Alias - Set Status FR */
        if (!((env->active_fpu.fcr0 & (1 << FCR0_UFRP)) && (rt == 0))) {
            return;
        }
        if (env->CP0_Config5 & (1 << CP0C5_UFR)) {
            env->CP0_Status |= (1 << CP0St_FR);
            compute_hflags(env);
        } else {
            do_raise_exception(env, EXCP_RI, GETPC());
        }
        break;
    case 5:
        /* FRE Support - clear Config5.FRE bit */
        if (!((env->active_fpu.fcr0 & (1 << FCR0_FREP)) && (rt == 0))) {
            return;
        }
        if (env->CP0_Config5 & (1 << CP0C5_UFE)) {
            env->CP0_Config5 &= ~(1 << CP0C5_FRE);
            compute_hflags(env);
        } else {
            helper_raise_exception(env, EXCP_RI);
        }
        break;
    case 6:
        /* FRE Support - set Config5.FRE bit */
        if (!((env->active_fpu.fcr0 & (1 << FCR0_FREP)) && (rt == 0))) {
            return;
        }
        if (env->CP0_Config5 & (1 << CP0C5_UFE)) {
            env->CP0_Config5 |= (1 << CP0C5_FRE);
            compute_hflags(env);
        } else {
            helper_raise_exception(env, EXCP_RI);
        }
        break;
    case 25:
        if ((env->insn_flags & ISA_MIPS32R6) || (arg1 & 0xffffff00)) {
            return;
        }
        env->active_fpu.fcr31 = (env->active_fpu.fcr31 & 0x017fffff) |
                                ((arg1 & 0xfe) << 24) |
                                ((arg1 & 0x1) << 23);
        break;
    case 26:
        if (arg1 & 0x007c0000) {
            return;
        }
        env->active_fpu.fcr31 = (env->active_fpu.fcr31 & 0xfffc0f83) |
                                (arg1 & 0x0003f07c);
        break;
    case 28:
        if (arg1 & 0x007c0000) {
            return;
        }
        env->active_fpu.fcr31 = (env->active_fpu.fcr31 & 0xfefff07c) |
                                (arg1 & 0x00000f83) |
                                ((arg1 & 0x4) << 22);
        break;
    case 31:
        env->active_fpu.fcr31 = (arg1 & env->active_fpu.fcr31_rw_bitmask) |
               (env->active_fpu.fcr31 & ~(env->active_fpu.fcr31_rw_bitmask));
        break;
    default:
        if (env->insn_flags & ISA_MIPS32R6) {
            do_raise_exception(env, EXCP_RI, GETPC());
        }
        return;
    }
    restore_fp_status(env);
    set_float_exception_flags(0, &env->active_fpu.fp_status);
    if ((GET_FP_ENABLE(env->active_fpu.fcr31) | 0x20) &
        GET_FP_CAUSE(env->active_fpu.fcr31)) {
        do_raise_exception(env, EXCP_FPE, GETPC());
    }
}